

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void __thiscall server_response::add_waiting_task_id(server_response *this,int id_task)

{
  common_log *log;
  int id_task_local;
  unique_lock<std::mutex> lock;
  
  id_task_local = id_task;
  if (0 < common_log_verbosity_thold) {
    log = common_log_main();
    common_log_add(log,GGML_LOG_LEVEL_DEBUG,
                   "srv  %12.*s: add task %d to waiting list. current waiting = %d (before add)\n",
                   0xc,"add_waiting_task_id",(ulong)(uint)id_task,
                   (int)(this->waiting_task_ids)._M_h._M_element_count);
  }
  httplib::detail::std::unique_lock<std::mutex>::unique_lock(&lock,&this->mutex_results);
  httplib::detail::std::__detail::
  _Insert_base<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::insert((_Insert_base<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            *)&this->waiting_task_ids,&id_task_local);
  httplib::detail::std::unique_lock<std::mutex>::~unique_lock(&lock);
  return;
}

Assistant:

void add_waiting_task_id(int id_task) {
        SRV_DBG("add task %d to waiting list. current waiting = %d (before add)\n", id_task, (int) waiting_task_ids.size());

        std::unique_lock<std::mutex> lock(mutex_results);
        waiting_task_ids.insert(id_task);
    }